

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CNumExp *expression)

{
  ISubtreeWrapper *_wrapper;
  CConstExpression *this_00;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CNumExp\n");
  _wrapper = (ISubtreeWrapper *)operator_new(0x10);
  this_00 = (CConstExpression *)operator_new(0x10);
  IRT::CConstExpression::CConstExpression(this_00,expression->number);
  _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b478;
  _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
  updateSubtreeWrapper(this,_wrapper);
  std::__cxx11::string::assign((char *)&this->currentObjectClassName);
  return;
}

Assistant:

void CBuildVisitor::Visit( CNumExp &expression ) {
    std::cout << "IRT builder: CNumExp\n";
    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            new IRT::CConstExpression( expression.number )
    ));

    currentObjectClassName = "";
}